

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

char * Abc_SopCreateAnd2(Mem_Flex_t *pMan,int fCompl0,int fCompl1)

{
  char *pcVar1;
  char local_6 [6];
  
  pcVar1 = Abc_SopRegister(pMan,local_6);
  return pcVar1;
}

Assistant:

char * Abc_SopCreateAnd2( Mem_Flex_t * pMan, int fCompl0, int fCompl1 )
{
    char Buffer[6];
    Buffer[0] = '1' - fCompl0;
    Buffer[1] = '1' - fCompl1;
    Buffer[2] = ' ';
    Buffer[3] = '1';
    Buffer[4] = '\n';
    Buffer[5] = 0;
    return Abc_SopRegister( pMan, Buffer );
}